

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O2

void __thiscall duckdb::TaskErrorManager::ThrowException(TaskErrorManager *this)

{
  reference this_00;
  lock_guard<std::mutex> elock;
  allocator local_31;
  string local_30;
  
  ::std::mutex::lock(&this->error_lock);
  this_00 = vector<duckdb::ErrorData,_true>::get<true>(&this->exceptions,0);
  ::std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_4bacfca + 9,&local_31);
  ErrorData::Throw(this_00,&local_30);
}

Assistant:

void ThrowException() {
		lock_guard<mutex> elock(error_lock);
		D_ASSERT(!exceptions.empty());
		auto &entry = exceptions[0];
		entry.Throw();
	}